

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  Op *pOVar2;
  Schema *pSVar3;
  uint uVar4;
  char *p;
  byte *pbVar5;
  Incrblob *pIVar6;
  sqlite_int64 iRow_00;
  int iVar7;
  Parse *pPVar8;
  Table *pTVar9;
  Index *pIVar10;
  Vdbe *p_00;
  uint uVar11;
  long lVar12;
  Schema **ppSVar13;
  Vdbe *v;
  char *pcVar14;
  FKey *pFVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  sqlite3 *db_00;
  int local_94;
  char *local_90;
  Table *local_88;
  int local_7c;
  Parse *local_78;
  byte *local_70;
  Incrblob *local_68;
  sqlite3 *local_60;
  char *local_58;
  int local_50;
  uint local_4c;
  ulong local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_90 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_7c = flags;
  local_70 = (byte *)zColumn;
  local_58 = zTable;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  local_68 = (Incrblob *)sqlite3DbMallocRaw(db,0x28);
  if (local_68 != (Incrblob *)0x0) {
    local_68->pCsr = (BtCursor *)0x0;
    local_68->pStmt = (sqlite3_stmt *)0x0;
    local_68->flags = 0;
    local_68->nByte = 0;
    local_68->iOffset = 0;
    local_68->iCol = 0;
    local_68->db = (sqlite3 *)0x0;
    pPVar8 = (Parse *)sqlite3DbMallocRaw(db,0x298);
    if (pPVar8 != (Parse *)0x0) {
      uVar4 = (uint)(flags != 0);
      local_50 = 4 - (uint)(local_7c != 0);
      local_48 = (ulong)((local_7c != 0) + 3);
      uVar20 = 0;
      local_94 = 0;
      local_78 = pPVar8;
      local_60 = db;
      do {
        pPVar8 = local_78;
        local_4c = uVar20;
        memset(local_78,0,0x298);
        pPVar8->db = db;
        sqlite3DbFree(db,local_90);
        local_90 = (char *)0x0;
        sqlite3BtreeEnterAll(db);
        pTVar9 = sqlite3LocateTable(pPVar8,0,local_58,local_38);
        if (pTVar9 == (Table *)0x0) {
          pTVar9 = (Table *)0x0;
        }
        else if ((pTVar9->tabFlags & 0x10) != 0) {
          sqlite3ErrorMsg(pPVar8,"cannot open virtual table: %s",local_58);
          pTVar9 = (Table *)0x0;
        }
        if (pTVar9 == (Table *)0x0) {
LAB_001225e4:
          pTVar9 = (Table *)0x0;
        }
        else if (pTVar9->pSelect != (Select *)0x0) {
          sqlite3ErrorMsg(pPVar8,"cannot open view: %s",local_58);
          goto LAB_001225e4;
        }
        db_00 = local_60;
        pbVar5 = local_70;
        if (pTVar9 == (Table *)0x0) {
          if (pPVar8->zErrMsg != (char *)0x0) {
            sqlite3DbFree(db,(void *)0x0);
            local_90 = pPVar8->zErrMsg;
            pPVar8->zErrMsg = (char *)0x0;
          }
LAB_001229b4:
          sqlite3BtreeLeaveAll(db);
          db_00 = db;
          iVar7 = 1;
          break;
        }
        uVar20 = (uint)pTVar9->nCol;
        if (pTVar9->nCol < 1) {
          uVar18 = 0;
        }
        else {
          uVar19 = 0;
          do {
            pbVar17 = (byte *)pTVar9->aCol[uVar19].zName;
            bVar1 = *pbVar17;
            pbVar16 = local_70;
            while ((bVar1 != 0 && (pbVar17 = pbVar17 + 1, ""[bVar1] == ""[*pbVar16]))) {
              pbVar16 = pbVar16 + 1;
              bVar1 = *pbVar17;
            }
            if (""[bVar1] == ""[*pbVar16]) goto LAB_0012266a;
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar20);
          uVar19 = (ulong)uVar20;
LAB_0012266a:
          uVar18 = (uint)uVar19;
        }
        local_88 = pTVar9;
        if (uVar18 == uVar20) {
          sqlite3DbFree(local_60,(void *)0x0);
          local_90 = sqlite3MPrintf(db_00,"no such column: \"%s\"",pbVar5);
          db = db_00;
          goto LAB_001229b4;
        }
        if (local_7c != 0) {
          if (((local_60->flags & 0x40000) == 0) ||
             (pFVar15 = pTVar9->pFKey, pFVar15 == (FKey *)0x0)) {
            pcVar14 = (char *)0x0;
          }
          else {
            pcVar14 = (char *)0x0;
            do {
              if (0 < (long)pFVar15->nCol) {
                lVar12 = 0;
                do {
                  if (*(uint *)((long)&pFVar15->aCol[0].iFrom + lVar12) == uVar18) {
                    pcVar14 = "foreign key";
                  }
                  lVar12 = lVar12 + 0x10;
                } while ((long)pFVar15->nCol * 0x10 != lVar12);
              }
              pFVar15 = pFVar15->pNextFrom;
            } while (pFVar15 != (FKey *)0x0);
          }
          for (pIVar10 = pTVar9->pIndex; pIVar10 != (Index *)0x0; pIVar10 = pIVar10->pNext) {
            if ((ulong)pIVar10->nColumn != 0) {
              uVar19 = 0;
              do {
                if (pIVar10->aiColumn[uVar19] == uVar18) {
                  pcVar14 = "indexed";
                }
                uVar19 = uVar19 + 1;
              } while (pIVar10->nColumn != uVar19);
            }
          }
          if (pcVar14 != (char *)0x0) {
            sqlite3DbFree(local_60,(void *)0x0);
            local_90 = sqlite3MPrintf(db_00,"cannot open %s column for writing",pcVar14);
            sqlite3BtreeLeaveAll(db_00);
            local_94 = 1;
            pPVar8 = local_78;
            iVar7 = local_94;
            break;
          }
        }
        p_00 = sqlite3VdbeCreate(local_60);
        local_68->pStmt = (sqlite3_stmt *)p_00;
        if (p_00 != (Vdbe *)0x0) {
          if (local_88->pSchema == (Schema *)0x0) {
            uVar19 = 0xfff0bdc0;
          }
          else {
            uVar20 = db_00->nDb;
            if ((int)uVar20 < 1) {
              uVar19 = 0;
            }
            else {
              ppSVar13 = &db_00->aDb->pSchema;
              uVar19 = 0;
              do {
                if (*ppSVar13 == local_88->pSchema) goto LAB_0012279b;
                uVar19 = uVar19 + 1;
                ppSVar13 = ppSVar13 + 4;
              } while (uVar20 != uVar19);
              uVar19 = (ulong)uVar20;
            }
          }
LAB_0012279b:
          sqlite3VdbeAddOpList(p_00,0xc,sqlite3_blob_open::openBlob);
          uVar20 = p_00->nOp;
          iVar7 = (int)uVar19;
          if (uVar20 != 0) {
            pOVar2 = p_00->aOp;
            pOVar2->p1 = iVar7;
            pOVar2->p2 = uVar4;
          }
          if (1 < uVar20) {
            pOVar2 = p_00->aOp;
            pOVar2[1].p1 = iVar7;
            pSVar3 = local_88->pSchema;
            pOVar2[1].p2 = pSVar3->schema_cookie;
            pOVar2[1].p3 = pSVar3->iGeneration;
          }
          uVar11 = 1 << ((byte)uVar19 & 0x1f);
          p_00->btreeMask = p_00->btreeMask | uVar11;
          if ((iVar7 != 1) && ((p_00->db->aDb[iVar7].pBt)->sharable != '\0')) {
            p_00->lockMask = p_00->lockMask | uVar11;
          }
          if (2 < uVar20) {
            p_00->aOp[2].p1 = iVar7;
            pOVar2 = p_00->aOp;
            pOVar2[2].p2 = local_88->tnum;
            pOVar2[2].p3 = uVar4;
          }
          sqlite3VdbeChangeP4(p_00,2,local_88->zName,0);
          sqlite3VdbeChangeToNoop(p_00,local_50);
          pTVar9 = local_88;
          if ((uint)local_48 < (uint)p_00->nOp) {
            pOVar2 = p_00->aOp;
            pOVar2[local_48].p2 = local_88->tnum;
            pOVar2[local_48].p3 = iVar7;
          }
          sqlite3VdbeChangeP4(p_00,(uint)local_48,(char *)((long)local_88->nCol + 1),-0xe);
          db_00 = local_60;
          if (7 < (uint)p_00->nOp) {
            p_00->aOp[7].p2 = (int)pTVar9->nCol;
          }
          if (local_60->mallocFailed == '\0') {
            local_78->nVar = 1;
            local_78->nTab = 1;
            local_78->nMem = 1;
            sqlite3VdbeMakeReady(p_00,local_78);
          }
        }
        pIVar6 = local_68;
        local_68->flags = uVar4;
        local_68->iCol = uVar18;
        local_68->db = db_00;
        sqlite3BtreeLeaveAll(db_00);
        iRow_00 = local_40;
        pPVar8 = local_78;
        iVar7 = local_94;
        if (db_00->mallocFailed != '\0') break;
        sqlite3_bind_int64(pIVar6->pStmt,1,local_40);
        iVar7 = blobSeekToRow(pIVar6,iRow_00,&local_90);
        pPVar8 = local_78;
        if (0x30 < local_4c) break;
        uVar20 = local_4c + 1;
        local_94 = 0x11;
        db = db_00;
      } while (iVar7 == 0x11);
      goto LAB_001229ca;
    }
  }
  pPVar8 = (Parse *)0x0;
  db_00 = db;
  iVar7 = 0;
LAB_001229ca:
  pIVar6 = local_68;
  if ((iVar7 == 0) && (db_00->mallocFailed == '\0')) {
    *ppBlob = (sqlite3_blob *)local_68;
  }
  else {
    if ((local_68 != (Incrblob *)0x0) && ((Vdbe *)local_68->pStmt != (Vdbe *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)local_68->pStmt);
    }
    sqlite3DbFree(db_00,pIVar6);
  }
  p = local_90;
  pcVar14 = "%s";
  if (local_90 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  sqlite3Error(db_00,iVar7,pcVar14,local_90);
  sqlite3DbFree(db_00,p);
  sqlite3DbFree(db_00,pPVar8);
  iVar7 = sqlite3ApiExit(db_00,iVar7);
  if (db_00->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db_00->mutex);
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const VdbeOpList openBlob[] = {
    {OP_Transaction, 0, 0, 0},     /* 0: Start a transaction */
    {OP_VerifyCookie, 0, 0, 0},    /* 1: Check the schema cookie */
    {OP_TableLock, 0, 0, 0},       /* 2: Acquire a read or write lock */

    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 3: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 4: Open cursor 0 for read/write */

    {OP_Variable, 1, 1, 1},        /* 5: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 6: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 7  */
    {OP_ResultRow, 1, 0, 0},       /* 8  */
    {OP_Goto, 0, 5, 0},            /* 9  */
    {OP_Close, 0, 0, 0},           /* 10 */
    {OP_Halt, 0, 0, 0},            /* 11 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

  flags = !!flags;                /* flags = (flags ? 1 : 0); */
  *ppBlob = 0;

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nColumn; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(db);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

      sqlite3VdbeAddOpList(v, sizeof(openBlob)/sizeof(VdbeOpList), openBlob);


      /* Configure the OP_Transaction */
      sqlite3VdbeChangeP1(v, 0, iDb);
      sqlite3VdbeChangeP2(v, 0, flags);

      /* Configure the OP_VerifyCookie */
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->pSchema->schema_cookie);
      sqlite3VdbeChangeP3(v, 1, pTab->pSchema->iGeneration);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 2);
#else
      sqlite3VdbeChangeP1(v, 2, iDb);
      sqlite3VdbeChangeP2(v, 2, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2, flags);
      sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 4 - flags);
      sqlite3VdbeChangeP2(v, 3 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 3 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 3+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 7, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3Error(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}